

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prolog.cpp
# Opt level: O2

void __thiscall Clause::print(Clause *this)

{
  (*(this->head->super_Term)._vptr_Term[3])();
  std::operator<<((ostream *)&std::cout," :- ");
  if (this->body != (Goal *)0x0) {
    Goal::print(this->body);
    return;
  }
  std::operator<<((ostream *)&std::cout,"true");
  return;
}

Assistant:

void print() const
    {
        head->print();
        std::cout << " :- ";
        if (body)
            body->print();
        else
            std::cout << "true";
    }